

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.hpp
# Opt level: O2

bool __thiscall csv::CSVField::operator==(CSVField *this,char *other)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  size_t sVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  __x._M_len = (this->sv)._M_len;
  __x._M_str = (this->sv)._M_str;
  sVar2 = strlen(other);
  __y._M_str = other;
  __y._M_len = sVar2;
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

CONSTEXPR bool CSVField::operator==(const char * other) const noexcept
    {
        return this->sv == other;
    }